

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_radio_interface.c
# Opt level: O0

void dlep_radio_remove_interface(dlep_radio_if *interface)

{
  dlep_radio_if *interface_local;
  
  _cleanup_interface(interface);
  oonf_stream_remove_managed(&interface->tcp,true);
  dlep_if_remove(&interface->interf);
  oonf_stream_free_managed_config(&interface->tcp_config);
  free((interface->interf).session.cfg.peer_type);
  abuf_free(&(interface->interf).udp_out);
  oonf_class_free(&_interface_class,interface);
  return;
}

Assistant:

void
dlep_radio_remove_interface(struct dlep_radio_if *interface) {
  /* close all sessions */
  _cleanup_interface(interface);

  /* cleanup tcp socket */
  oonf_stream_remove_managed(&interface->tcp, true);

  /* cleanup generic interface */
  dlep_if_remove(&interface->interf);

  /* free memory */
  oonf_stream_free_managed_config(&interface->tcp_config);
  free(interface->interf.session.cfg.peer_type);
  abuf_free(&interface->interf.udp_out);
  oonf_class_free(&_interface_class, interface);
}